

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QList<QUrl> * __thiscall
QFileDialogPrivate::addDefaultSuffixToUrls
          (QList<QUrl> *__return_storage_ptr__,QFileDialogPrivate *this,QList<QUrl> *urlsToFix)

{
  bool bVar1;
  undefined1 *puVar2;
  long lVar3;
  QUrl *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QUrl url;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_50 [16];
  QArrayDataPointer<char16_t> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QUrl>::reserve(__return_storage_ptr__,(urlsToFix->d).size);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::defaultSuffix();
  pQVar4 = (urlsToFix->d).ptr;
  for (lVar3 = (urlsToFix->d).size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
    url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&url,pQVar4);
    if ((undefined1 *)local_68.size != (undefined1 *)0x0) {
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d._0_4_ = 0xaaaaaaaa;
      local_88.d._4_4_ = 0xaaaaaaaa;
      local_88.ptr._0_4_ = 0xaaaaaaaa;
      local_88.ptr._4_4_ = 0xaaaaaaaa;
      QUrl::path(&local_88,&url,0x7f00000);
      puVar2 = (undefined1 *)QString::lastIndexOf((QString *)&local_88,(QChar)0x2f,CaseSensitive);
      if (puVar2 != (undefined1 *)
                    ((long)&((QArrayDataPointer<char16_t> *)(local_88.size + -0x18))->size + 7)) {
        local_50._8_8_ = CONCAT44(local_88.ptr._4_4_,local_88.ptr._0_4_);
        local_50._0_8_ = local_88.size;
        local_a0._0_16_ = QStringView::mid((QStringView *)local_50,(qsizetype)(puVar2 + 1),-1);
        bVar1 = QStringView::contains((QStringView *)&local_a0,(QChar)0x2e,CaseSensitive);
        if (!bVar1) {
          local_50._0_8_ = &local_88;
          local_50._8_2_ = 0x2e;
          local_40 = &local_68;
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
          convertTo<QString>((QString *)&local_a0,
                             (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
                              *)local_50);
          QUrl::setPath((QString *)&url,(ParsingMode)&local_a0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    QList<QUrl>::emplaceBack<QUrl_const&>(__return_storage_ptr__,&url);
    QUrl::~QUrl(&url);
    pQVar4 = pQVar4 + 1;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QFileDialogPrivate::addDefaultSuffixToUrls(const QList<QUrl> &urlsToFix) const
{
    QList<QUrl> urls;
    urls.reserve(urlsToFix.size());
    // if the filename has no suffix, add the default suffix
    const QString defaultSuffix = options->defaultSuffix();
    for (QUrl url : urlsToFix) {
        if (!defaultSuffix.isEmpty()) {
            const QString urlPath = url.path();
            const auto idx = urlPath.lastIndexOf(u'/');
            if (idx != (urlPath.size() - 1) && !QStringView{urlPath}.mid(idx + 1).contains(u'.'))
                url.setPath(urlPath + u'.' + defaultSuffix);
        }
        urls.append(url);
    }
    return urls;
}